

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O2

wrapper<app,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_app>_>
__thiscall
boost::ext::di::v1_3_0::core::
injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,example,example,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,int>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,double>>>>>
::
create_successful_impl__<boost::ext::di::v1_3_0::aux::integral_constant<bool,true>,app,boost::ext::di::v1_3_0::no_name>
          (injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,example,example,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,int>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,double>>>>>
           *this)

{
  wrapper wVar1;
  scope<app,app> local_9;
  provider<boost::ext::di::v1_3_0::aux::pair<app,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_ref_fwd<app>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>_>_>
  local_8;
  
  local_8.injector_ =
       (injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>_>
        *)this;
  wVar1 = scopes::deduce::scope<app,app>::
          create<app,boost::ext::di::v1_3_0::no_name,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<app,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_1st_ref_fwd<app>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,example,example,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,int>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,double>>>>>>>
                    (&local_9,&local_8);
  return (wrapper<app,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_app>_>
          )wVar1.object.ex;
}

Assistant:

auto create_successful_impl__() const {
    auto&& dependency = binder::resolve<T, TName>((injector*)this);
    using dependency_t = typename aux::remove_reference<decltype(dependency)>::type;
    using ctor_t = typename type_traits::ctor_traits__<binder::resolve_template_t<injector, typename dependency_t::given>, T,
                                                       typename dependency_t::ctor>::type;
    using provider_t = successful::provider<ctor_t, injector>;
    auto& creatable_dept = static_cast<dependency__<dependency_t>&>(dependency);
    using wrapper_t = decltype(creatable_dept.template create<T, TName>(provider_t{this}));
    using create_t = referable_t<T, config, dependency__<dependency_t>>;
    return successful::wrapper<create_t, wrapper_t>{creatable_dept.template create<T, TName>(provider_t{this})};
  }